

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O0

BIP9Stats * __thiscall
AbstractThresholdConditionChecker::GetStateStatisticsFor
          (AbstractThresholdConditionChecker *this,CBlockIndex *pindex,Params *params,
          vector<bool,_std::allocator<bool>_> *signalling_blocks)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  undefined8 in_RCX;
  vector<bool,_std::allocator<bool>_> *in_RDX;
  _Bit_reference *in_RSI;
  BIP9Stats *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  BIP9Stats *stats;
  CBlockIndex *currentIndex;
  int count;
  int elapsed;
  int blocks_in_period;
  bool *in_stack_ffffffffffffff88;
  BIP9Stats *__n;
  int local_4c;
  int local_48;
  int local_44;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = in_RDI;
  memset(in_RDI,0,0x14);
  iVar2 = (*(code *)(((_Bvector_base<std::allocator<bool>_> *)&in_RSI->_M_p)->_M_impl).
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[4])
                    (in_RSI,in_RCX);
  __n->period = iVar2;
  iVar2 = (*(code *)(((_Bvector_base<std::allocator<bool>_> *)&in_RSI->_M_p)->_M_impl).
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[5])
                    (in_RSI,in_RCX);
  __n->threshold = iVar2;
  if (in_RDX != (vector<bool,_std::allocator<bool>_> *)0x0) {
    local_44 = (int)(in_RDX->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset %
               __n->period + 1;
    if (in_R8 != 0) {
      std::vector<bool,_std::allocator<bool>_>::assign
                ((vector<bool,_std::allocator<bool>_> *)in_RSI,(size_type)in_RDI,
                 in_stack_ffffffffffffff88);
    }
    local_48 = 0;
    local_4c = 0;
    do {
      local_48 = local_48 + 1;
      local_44 = local_44 + -1;
      uVar3 = (*(code *)*(((_Bvector_base<std::allocator<bool>_> *)&in_RSI->_M_p)->_M_impl).
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                        (in_RSI,in_RDX,in_RCX);
      if (((uVar3 & 1) != 0) && (local_4c = local_4c + 1, in_R8 != 0)) {
        std::vector<bool,_std::allocator<bool>_>::at(in_RDX,(size_type)__n);
        std::_Bit_reference::operator=(in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
      }
      in_RDX = *(vector<bool,_std::allocator<bool>_> **)
                &(in_RDX->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
    } while (0 < local_44);
    __n->elapsed = local_48;
    __n->count = local_4c;
    __n->possible = __n->elapsed - local_4c <= __n->period - __n->threshold;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

BIP9Stats AbstractThresholdConditionChecker::GetStateStatisticsFor(const CBlockIndex* pindex, const Consensus::Params& params, std::vector<bool>* signalling_blocks) const
{
    BIP9Stats stats = {};

    stats.period = Period(params);
    stats.threshold = Threshold(params);

    if (pindex == nullptr) return stats;

    // Find how many blocks are in the current period
    int blocks_in_period = 1 + (pindex->nHeight % stats.period);

    // Reset signalling_blocks
    if (signalling_blocks) {
        signalling_blocks->assign(blocks_in_period, false);
    }

    // Count from current block to beginning of period
    int elapsed = 0;
    int count = 0;
    const CBlockIndex* currentIndex = pindex;
    do {
        ++elapsed;
        --blocks_in_period;
        if (Condition(currentIndex, params)) {
            ++count;
            if (signalling_blocks) signalling_blocks->at(blocks_in_period) = true;
        }
        currentIndex = currentIndex->pprev;
    } while(blocks_in_period > 0);

    stats.elapsed = elapsed;
    stats.count = count;
    stats.possible = (stats.period - stats.threshold ) >= (stats.elapsed - count);

    return stats;
}